

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9_hashmap_sort(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  jx9_hashmap *pMap_00;
  int iVar1;
  int local_34;
  sxi32 iCmpFlags;
  jx9_hashmap *pMap;
  jx9_value **apArg_local;
  int nArg_local;
  jx9_context *pCtx_local;
  
  if ((nArg < 1) || (iVar1 = jx9_value_is_json_array(*apArg), iVar1 == 0)) {
    jx9_result_bool(pCtx,0);
  }
  else {
    pMap_00 = (jx9_hashmap *)((*apArg)->x).pOther;
    if (1 < pMap_00->nEntry) {
      local_34 = 0;
      if ((1 < nArg) && (local_34 = jx9_value_to_int(apArg[1]), local_34 == 3)) {
        local_34 = 0;
      }
      HashmapMergeSort(pMap_00,HashmapCmpCallback1,(void *)(long)local_34);
      HashmapSortRehash(pMap_00);
    }
    jx9_result_bool(pCtx,1);
  }
  return 0;
}

Assistant:

static int jx9_hashmap_sort(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	jx9_hashmap *pMap;
	/* Make sure we are dealing with a valid hashmap */
	if( nArg < 1 || !jx9_value_is_json_array(apArg[0]) ){
		/* Missing/Invalid arguments, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Point to the internal representation of the input hashmap */
	pMap = (jx9_hashmap *)apArg[0]->x.pOther;
	if( pMap->nEntry > 1 ){
		sxi32 iCmpFlags = 0;
		if( nArg > 1 ){
			/* Extract comparison flags */
			iCmpFlags = jx9_value_to_int(apArg[1]);
			if( iCmpFlags == 3 /* SORT_REGULAR */ ){
				iCmpFlags = 0; /* Standard comparison */
			}
		}
		/* Do the merge sort */
		HashmapMergeSort(pMap, HashmapCmpCallback1, SX_INT_TO_PTR(iCmpFlags));
		/* Rehash [Do not maintain index association as requested by the JX9 specification] */
		HashmapSortRehash(pMap);
	}
	/* All done, return TRUE */
	jx9_result_bool(pCtx, 1);
	return JX9_OK;
}